

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_xml.cpp
# Opt level: O1

void __thiscall
Kumu::XMLElement::RenderElement(XMLElement *this,string *outbuf,ui32_t *depth,bool *pretty)

{
  ElementList *pEVar1;
  XMLElement *pXVar2;
  _List_node_base *p_Var3;
  ui32_t *puVar4;
  bool *pretty_00;
  ui32_t uVar5;
  ui32_t local_44;
  ui32_t *local_40;
  bool *local_38;
  
  uVar5 = *depth;
  local_40 = depth;
  local_38 = pretty;
  if ((uVar5 != 0 & *pretty) == 1) {
    do {
      std::__cxx11::string::append((char *)outbuf);
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  std::__cxx11::string::append((char *)outbuf);
  std::__cxx11::string::_M_append((char *)outbuf,(ulong)(this->m_Name)._M_dataplus._M_p);
  for (pXVar2 = (XMLElement *)
                (this->m_AttrList).super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>.
                _M_impl._M_node.super__List_node_base._M_next; pXVar2 != this;
      pXVar2 = (XMLElement *)
               (pXVar2->m_AttrList).super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>.
               _M_impl._M_node.super__List_node_base._M_next) {
    std::__cxx11::string::append((char *)outbuf);
    std::__cxx11::string::_M_append
              ((char *)outbuf,
               (pXVar2->m_AttrList).super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>.
               _M_impl._M_node._M_size);
    std::__cxx11::string::append((char *)outbuf);
    std::__cxx11::string::_M_append((char *)outbuf,(ulong)pXVar2->m_Namespace);
    std::__cxx11::string::append((char *)outbuf);
  }
  std::__cxx11::string::append((char *)outbuf);
  pEVar1 = &this->m_ChildList;
  if ((this->m_ChildList).super__List_base<Kumu::XMLElement_*,_std::allocator<Kumu::XMLElement_*>_>.
      _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)pEVar1) {
    if ((this->m_Body)._M_string_length != 0) {
      std::__cxx11::string::_M_append((char *)outbuf,(ulong)(this->m_Body)._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::append((char *)outbuf);
    if ((this->m_Body)._M_string_length != 0) {
      std::__cxx11::string::_M_append((char *)outbuf,(ulong)(this->m_Body)._M_dataplus._M_p);
    }
    pretty_00 = local_38;
    puVar4 = local_40;
    for (p_Var3 = (pEVar1->super__List_base<Kumu::XMLElement_*,_std::allocator<Kumu::XMLElement_*>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
        p_Var3 != (_List_node_base *)pEVar1; p_Var3 = p_Var3->_M_next) {
      local_44 = *puVar4 + 1;
      RenderElement((XMLElement *)p_Var3[1]._M_next,outbuf,&local_44,pretty_00);
    }
    uVar5 = *puVar4;
    if ((uVar5 != 0 & *pretty_00) == 1) {
      do {
        std::__cxx11::string::append((char *)outbuf);
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
  }
  std::__cxx11::string::append((char *)outbuf);
  std::__cxx11::string::_M_append((char *)outbuf,(ulong)(this->m_Name)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)outbuf);
  return;
}

Assistant:

void
Kumu::XMLElement::RenderElement(std::string& outbuf, const ui32_t& depth, const bool& pretty) const
{
  if ( pretty )
    {
      add_spacer(outbuf, depth);
    }

  outbuf += "<";
  outbuf += m_Name;

  // render attributes
  for ( Attr_i i = m_AttrList.begin(); i != m_AttrList.end(); ++i )
    {
      outbuf += " ";
      outbuf += (*i).name;
      outbuf += "=\"";
      outbuf += (*i).value;
      outbuf += "\"";
    }

  outbuf += ">";

  // body contents and children
  if ( ! m_ChildList.empty() )
    {
      outbuf += "\n";

      // render body
      if ( m_Body.length() > 0 )
	{
	  outbuf += m_Body;
	}

      for ( Elem_i i = m_ChildList.begin(); i != m_ChildList.end(); ++i )
	{
	  (*i)->RenderElement(outbuf, depth + 1, pretty);
	}

      if ( pretty )
	{
	  add_spacer(outbuf, depth);
	}
    }
  else if ( m_Body.length() > 0 )
    {
      outbuf += m_Body;
    }

  outbuf += "</";
  outbuf += m_Name;
  outbuf += ">\n";
}